

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_context.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::Context::InitializeFieldGeneratorInfoForFields
          (Context *this,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *fields)

{
  java *pjVar1;
  _Bit_pointer *ppuVar2;
  java *this_00;
  java *pjVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  __type _Var5;
  LogMessage *pLVar6;
  pointer ppFVar7;
  mapped_type *this_01;
  java *pjVar8;
  pointer ppFVar9;
  FieldDescriptor *pFVar10;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *field_00;
  AlphaNum *a;
  AlphaNum *a_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *__n;
  java *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  ulong uVar11;
  string *__rhs;
  bool bVar12;
  reference rVar13;
  string local_250;
  string local_230;
  undefined1 local_210 [8];
  vector<bool,_std::allocator<bool>_> is_conflict;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  long local_168;
  ulong local_160;
  FieldDescriptor *local_158;
  reference local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  undefined1 local_100 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  conflict_reason;
  undefined1 local_d8 [8];
  FieldGeneratorInfo info;
  FieldDescriptor *field;
  
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_210,
             (long)(fields->
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(fields->
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)local_d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_100,
           (long)(fields->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(fields->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)local_d8);
  uVar11 = 1;
  __n = (FieldDescriptor *)0x0;
  do {
    ppFVar7 = (fields->
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    ppFVar9 = (fields->
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    pFVar10 = (FieldDescriptor *)((long)ppFVar9 - (long)ppFVar7 >> 3);
    if (pFVar10 <= __n) {
      for (uVar11 = 0; uVar11 < (ulong)((long)ppFVar9 - (long)ppFVar7 >> 3); uVar11 = uVar11 + 1) {
        info.disambiguated_reason.field_2._8_8_ = ppFVar7[uVar11];
        info.name._M_dataplus._M_p = (pointer)0x0;
        local_d8 = (undefined1  [8])&info.name._M_string_length;
        info.name._M_string_length._0_1_ = 0;
        info.name.field_2._8_8_ = &info.capitalized_name._M_string_length;
        info.capitalized_name._M_dataplus._M_p = (pointer)0x0;
        info.capitalized_name._M_string_length._0_1_ = 0;
        info.capitalized_name.field_2._8_8_ = &info.disambiguated_reason._M_string_length;
        info.disambiguated_reason._M_dataplus._M_p = (pointer)0x0;
        info.disambiguated_reason._M_string_length._0_1_ = 0;
        CamelCaseFieldName_abi_cxx11_
                  ((string *)&local_150,(java *)info.disambiguated_reason.field_2._8_8_,pFVar10);
        std::__cxx11::string::operator=((string *)local_d8,(string *)&local_150);
        std::__cxx11::string::~string((string *)&local_150);
        UnderscoresToCapitalizedCamelCase_abi_cxx11_
                  ((string *)&local_150,(java *)info.disambiguated_reason.field_2._8_8_,field_00);
        std::__cxx11::string::operator=
                  ((string *)(info.name.field_2._M_local_buf + 8),(string *)&local_150);
        std::__cxx11::string::~string((string *)&local_150);
        rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)local_210,uVar11);
        if ((*rVar13._M_p & rVar13._M_mask) != 0) {
          strings::AlphaNum::AlphaNum
                    ((AlphaNum *)&local_150,*(int *)(info.disambiguated_reason.field_2._8_8_ + 0x44)
                    );
          StrCat_abi_cxx11_(&local_120,(protobuf *)&local_150,a);
          std::__cxx11::string::append((string *)local_d8);
          std::__cxx11::string::~string((string *)&local_120);
          strings::AlphaNum::AlphaNum
                    ((AlphaNum *)&local_150,*(int *)(info.disambiguated_reason.field_2._8_8_ + 0x44)
                    );
          StrCat_abi_cxx11_(&local_120,(protobuf *)&local_150,a_00);
          std::__cxx11::string::append((string *)(info.name.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)&local_120);
          std::__cxx11::string::_M_assign
                    ((string *)(info.capitalized_name.field_2._M_local_buf + 8));
        }
        this_01 = std::
                  map<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::FieldGeneratorInfo,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_google::protobuf::compiler::java::FieldGeneratorInfo>_>_>
                  ::operator[](&this->field_generator_info_map_,
                               (key_type *)((long)&info.disambiguated_reason.field_2 + 8));
        FieldGeneratorInfo::operator=(this_01,(FieldGeneratorInfo *)local_d8);
        FieldGeneratorInfo::~FieldGeneratorInfo((FieldGeneratorInfo *)local_d8);
        ppFVar7 = (fields->
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        ppFVar9 = (fields->
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        pFVar10 = extraout_RDX_01;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_100);
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                ((_Bvector_base<std::allocator<bool>_> *)local_210);
      return;
    }
    this_00 = (java *)ppFVar7[(long)__n];
    UnderscoresToCapitalizedCamelCase_abi_cxx11_(&local_250,this_00,pFVar10);
    local_158 = __n + 1;
    pFVar10 = extraout_RDX;
    local_160 = uVar11;
    while( true ) {
      ppFVar7 = (fields->
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(fields->
                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar7 >> 3) <= uVar11)
      break;
      this_02 = (java *)ppFVar7[uVar11];
      UnderscoresToCapitalizedCamelCase_abi_cxx11_(&local_230,this_02,pFVar10);
      _Var5 = std::operator==(&local_250,&local_230);
      if (_Var5) {
        _local_d8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                              ((vector<bool,_std::allocator<bool>_> *)local_210,uVar11);
        *local_d8 = *local_d8 | local_d8._8_8_;
        local_150 = std::vector<bool,_std::allocator<bool>_>::operator[]
                              ((vector<bool,_std::allocator<bool>_> *)local_210,(size_type)__n);
        std::_Bit_reference::operator=(&local_150,(_Bit_reference *)local_d8);
        pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&info.disambiguated_reason.field_2 + 8);
        std::operator+(pbVar4,"capitalized name of field \"",
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        this_00);
        std::operator+(&local_120,pbVar4,"\" conflicts with field \"");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_150,&local_120,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        this_02);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_150,"\"");
        std::__cxx11::string::operator=
                  ((string *)((long)local_100 + uVar11 * 0x20),(string *)local_d8);
        std::__cxx11::string::_M_assign((string *)((long)local_100 + __n * 0x20));
        std::__cxx11::string::~string((string *)local_d8);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::~string
                  ((string *)(info.disambiguated_reason.field_2._M_local_buf + 8));
      }
      else {
        local_168 = uVar11 * 0x20;
        conflict_reason.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)((long)local_100 + uVar11 * 0x20);
        bVar12 = *(int *)(this_00 + 0x3c) == 3;
        pjVar3 = this_00;
        pbVar4 = &local_250;
        __rhs = &local_230;
        do {
          __lhs = pbVar4;
          pjVar8 = pjVar3;
          pjVar1 = this_02 + 0x3c;
          if (bVar12) {
            if (*(int *)pjVar1 == 3) break;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_d8,__lhs,"Count");
            _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_d8,__rhs);
            std::__cxx11::string::~string((string *)local_d8);
            if (_Var5) {
              std::operator+(&local_188,"both repeated field \"",
                             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                              pjVar8);
              std::operator+(&local_1a8,&local_188,"\" and singular ");
              std::operator+(&local_1c8,&local_1a8,"field \"");
              ppuVar2 = &is_conflict.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_end_of_storage;
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ppuVar2,&local_1c8,
                             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                              this_02);
              pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&info.disambiguated_reason.field_2 + 8);
              std::operator+(pbVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)ppuVar2,"\" generate the method \"");
              std::operator+(&local_120,pbVar4,"get");
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_150,&local_120,__lhs);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&local_150,"Count()\"");
            }
            else {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_d8,__lhs,"List");
              _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_d8,__rhs);
              std::__cxx11::string::~string((string *)local_d8);
              if (!_Var5) break;
              std::operator+(&local_188,"both repeated field \"",
                             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                              pjVar8);
              std::operator+(&local_1a8,&local_188,"\" and singular ");
              std::operator+(&local_1c8,&local_1a8,"field \"");
              ppuVar2 = &is_conflict.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_end_of_storage;
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ppuVar2,&local_1c8,
                             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                              this_02);
              pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&info.disambiguated_reason.field_2 + 8);
              std::operator+(pbVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)ppuVar2,"\" generate the method \"");
              std::operator+(&local_120,pbVar4,"get");
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_150,&local_120,__lhs);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&local_150,"List()\"");
            }
            std::__cxx11::string::operator=
                      ((string *)
                       conflict_reason.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_d8);
            std::__cxx11::string::~string((string *)local_d8);
            std::__cxx11::string::~string((string *)&local_150);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::~string
                      ((string *)(info.disambiguated_reason.field_2._M_local_buf + 8));
            std::__cxx11::string::~string
                      ((string *)
                       &is_conflict.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_end_of_storage);
            std::__cxx11::string::~string((string *)&local_1c8);
            std::__cxx11::string::~string((string *)&local_1a8);
            std::__cxx11::string::~string((string *)&local_188);
            _local_d8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                  ((vector<bool,_std::allocator<bool>_> *)local_210,uVar11);
            *local_d8 = *local_d8 | local_d8._8_8_;
            local_150 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                  ((vector<bool,_std::allocator<bool>_> *)local_210,(size_type)__n);
            std::_Bit_reference::operator=(&local_150,(_Bit_reference *)local_d8);
            std::__cxx11::string::_M_assign((string *)((long)local_100 + __n * 0x20));
            break;
          }
          bVar12 = true;
          pjVar3 = this_02;
          this_02 = pjVar8;
          pbVar4 = __rhs;
          __rhs = __lhs;
        } while (*(int *)pjVar1 == 3);
      }
      std::__cxx11::string::~string((string *)&local_230);
      uVar11 = uVar11 + 1;
      pFVar10 = extraout_RDX_00;
    }
    rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)local_210,(size_type)__n);
    uVar11 = local_160;
    if ((*rVar13._M_p & rVar13._M_mask) != 0) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_d8,LOGLEVEL_WARNING,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/compiler/java/java_context.cc"
                 ,0x95);
      pLVar6 = (LogMessage *)
               google::protobuf::internal::LogMessage::operator<<((LogMessage *)local_d8,"field \"")
      ;
      pLVar6 = (LogMessage *)
               google::protobuf::internal::LogMessage::operator<<(pLVar6,*(string **)(this_00 + 8));
      pLVar6 = (LogMessage *)
               google::protobuf::internal::LogMessage::operator<<(pLVar6,"\" is conflicting ");
      pLVar6 = (LogMessage *)
               google::protobuf::internal::LogMessage::operator<<(pLVar6,"with another field: ");
      pLVar6 = (LogMessage *)
               google::protobuf::internal::LogMessage::operator<<
                         (pLVar6,(string *)((long)local_100 + __n * 0x20));
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_150,pLVar6);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_d8);
    }
    std::__cxx11::string::~string((string *)&local_250);
    uVar11 = uVar11 + 1;
    __n = local_158;
  } while( true );
}

Assistant:

void Context::InitializeFieldGeneratorInfoForFields(
    const std::vector<const FieldDescriptor*>& fields) {
  // Find out all fields that conflict with some other field in the same
  // message.
  std::vector<bool> is_conflict(fields.size());
  std::vector<std::string> conflict_reason(fields.size());
  for (int i = 0; i < fields.size(); ++i) {
    const FieldDescriptor* field = fields[i];
    const std::string& name = UnderscoresToCapitalizedCamelCase(field);
    for (int j = i + 1; j < fields.size(); ++j) {
      const FieldDescriptor* other = fields[j];
      const std::string& other_name = UnderscoresToCapitalizedCamelCase(other);
      if (name == other_name) {
        is_conflict[i] = is_conflict[j] = true;
        conflict_reason[i] = conflict_reason[j] =
            "capitalized name of field \"" + field->name() +
            "\" conflicts with field \"" + other->name() + "\"";
      } else if (IsConflicting(field, name, other, other_name,
                               &conflict_reason[j])) {
        is_conflict[i] = is_conflict[j] = true;
        conflict_reason[i] = conflict_reason[j];
      }
    }
    if (is_conflict[i]) {
      GOOGLE_LOG(WARNING) << "field \"" << field->full_name() << "\" is conflicting "
                   << "with another field: " << conflict_reason[i];
    }
  }
  for (int i = 0; i < fields.size(); ++i) {
    const FieldDescriptor* field = fields[i];
    FieldGeneratorInfo info;
    info.name = CamelCaseFieldName(field);
    info.capitalized_name = UnderscoresToCapitalizedCamelCase(field);
    // For fields conflicting with some other fields, we append the field
    // number to their field names in generated code to avoid conflicts.
    if (is_conflict[i]) {
      info.name += StrCat(field->number());
      info.capitalized_name += StrCat(field->number());
      info.disambiguated_reason = conflict_reason[i];
    }
    field_generator_info_map_[field] = info;
  }
}